

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<VkSpecParser::Command*>,long_long>
               (reverse_iterator<VkSpecParser::Command_*> first,longlong n,
               reverse_iterator<VkSpecParser::Command_*> d_first)

{
  Command *pCVar1;
  Data *pDVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  TypedName *pTVar7;
  int *piVar8;
  Command *pCVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Command *pCVar12;
  Command *pCVar13;
  long in_FS_OFFSET;
  Destructor local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_58.intermediate;
  local_58.end.current = (Command *)((d_first.current)->cmd).name.d.d;
  pCVar12 = local_58.end.current + -n;
  pCVar1 = (Command *)((first.current)->cmd).name.d.d;
  pCVar13 = pCVar1;
  pCVar9 = pCVar12;
  if (pCVar12 < pCVar1) {
    pCVar13 = pCVar12;
    pCVar9 = pCVar1;
  }
  pCVar1 = (Command *)((d_first.current)->cmd).name.d.d;
  while (pCVar1 != pCVar9) {
    pDVar2 = ((first.current)->cmd).name.d.d;
    pDVar3 = (Data *)pDVar2[-7].super_QArrayData.alloc;
    pDVar2[-7].super_QArrayData.alloc = 0;
    pCVar1[-1].cmd.name.d.d = pDVar3;
    pcVar4 = *(char16_t **)&pDVar2[-6].super_QArrayData;
    pDVar2[-6].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-6].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pCVar1[-1].cmd.name.d.ptr = pcVar4;
    qVar5 = pDVar2[-6].super_QArrayData.alloc;
    pDVar2[-6].super_QArrayData.alloc = 0;
    pCVar1[-1].cmd.name.d.size = qVar5;
    pDVar3 = *(Data **)&pDVar2[-5].super_QArrayData;
    pDVar2[-5].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-5].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pCVar1[-1].cmd.type.d.d = pDVar3;
    pcVar4 = (char16_t *)pDVar2[-5].super_QArrayData.alloc;
    pDVar2[-5].super_QArrayData.alloc = 0;
    pCVar1[-1].cmd.type.d.ptr = pcVar4;
    qVar5 = *(qsizetype *)&pDVar2[-4].super_QArrayData;
    pDVar2[-4].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-4].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pCVar1[-1].cmd.type.d.size = qVar5;
    pDVar3 = (Data *)pDVar2[-4].super_QArrayData.alloc;
    pDVar2[-4].super_QArrayData.alloc = 0;
    pCVar1[-1].cmd.typeSuffix.d.d = pDVar3;
    pcVar4 = *(char16_t **)&pDVar2[-3].super_QArrayData;
    pDVar2[-3].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-3].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pCVar1[-1].cmd.typeSuffix.d.ptr = pcVar4;
    qVar5 = pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = 0;
    pCVar1[-1].cmd.typeSuffix.d.size = qVar5;
    pDVar6 = *(Data **)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-2].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pCVar1[-1].args.d.d = pDVar6;
    pTVar7 = (TypedName *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = 0;
    pCVar1[-1].args.d.ptr = pTVar7;
    qVar5 = *(qsizetype *)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-1].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pCVar1[-1].args.d.size = qVar5;
    pCVar1[-1].deviceLevel = SUB81(pDVar2[-1].super_QArrayData.alloc,0);
    ((d_first.current)->cmd).name.d.d =
         (Data *)&((d_first.current)->cmd).name.d.d[-7].super_QArrayData.alloc;
    ((first.current)->cmd).name.d.d =
         (Data *)&((first.current)->cmd).name.d.d[-7].super_QArrayData.alloc;
    pCVar1 = (Command *)((d_first.current)->cmd).name.d.d;
  }
  local_58.intermediate.current = (Command *)((d_first.current)->cmd).name.d.d;
  while (pCVar1 = (Command *)((d_first.current)->cmd).name.d.d, pCVar1 != pCVar12) {
    pDVar2 = ((first.current)->cmd).name.d.d;
    pDVar3 = pCVar1[-1].cmd.name.d.d;
    pCVar1[-1].cmd.name.d.d = (Data *)pDVar2[-7].super_QArrayData.alloc;
    pDVar2[-7].super_QArrayData.alloc = (qsizetype)pDVar3;
    pcVar4 = pCVar1[-1].cmd.name.d.ptr;
    pCVar1[-1].cmd.name.d.ptr = *(char16_t **)&pDVar2[-6].super_QArrayData;
    *(char16_t **)&pDVar2[-6].super_QArrayData = pcVar4;
    qVar5 = pCVar1[-1].cmd.name.d.size;
    pCVar1[-1].cmd.name.d.size = pDVar2[-6].super_QArrayData.alloc;
    pDVar2[-6].super_QArrayData.alloc = qVar5;
    pDVar3 = pCVar1[-1].cmd.type.d.d;
    pCVar1[-1].cmd.type.d.d = *(Data **)&pDVar2[-5].super_QArrayData;
    *(Data **)&pDVar2[-5].super_QArrayData = pDVar3;
    pcVar4 = pCVar1[-1].cmd.type.d.ptr;
    pCVar1[-1].cmd.type.d.ptr = (char16_t *)pDVar2[-5].super_QArrayData.alloc;
    pDVar2[-5].super_QArrayData.alloc = (qsizetype)pcVar4;
    uVar10 = *(undefined4 *)&pCVar1[-1].cmd.type.d.size;
    uVar11 = *(undefined4 *)((long)&pCVar1[-1].cmd.type.d.size + 4);
    pCVar1[-1].cmd.type.d.size = *(qsizetype *)&pDVar2[-4].super_QArrayData;
    pDVar2[-4].super_QArrayData.ref_ = (QBasicAtomicInt)uVar10;
    pDVar2[-4].super_QArrayData.flags = (ArrayOptions)uVar11;
    pDVar3 = pCVar1[-1].cmd.typeSuffix.d.d;
    pCVar1[-1].cmd.typeSuffix.d.d = (Data *)pDVar2[-4].super_QArrayData.alloc;
    pDVar2[-4].super_QArrayData.alloc = (qsizetype)pDVar3;
    pcVar4 = pCVar1[-1].cmd.typeSuffix.d.ptr;
    pCVar1[-1].cmd.typeSuffix.d.ptr = *(char16_t **)&pDVar2[-3].super_QArrayData;
    *(char16_t **)&pDVar2[-3].super_QArrayData = pcVar4;
    qVar5 = pCVar1[-1].cmd.typeSuffix.d.size;
    pCVar1[-1].cmd.typeSuffix.d.size = pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = qVar5;
    QArrayDataPointer<VkSpecParser::TypedName>::operator=
              (&pCVar1[-1].args.d,(QArrayDataPointer<VkSpecParser::TypedName> *)(pDVar2 + -2));
    pCVar1[-1].deviceLevel = SUB81(pDVar2[-1].super_QArrayData.alloc,0);
    ((d_first.current)->cmd).name.d.d =
         (Data *)&((d_first.current)->cmd).name.d.d[-7].super_QArrayData.alloc;
    ((first.current)->cmd).name.d.d =
         (Data *)&((first.current)->cmd).name.d.d[-7].super_QArrayData.alloc;
  }
  local_58.iter = &local_58.end;
  while (pCVar1 = (Command *)((first.current)->cmd).name.d.d, pCVar1 != pCVar13) {
    ((first.current)->cmd).name.d.d = (Data *)(pCVar1 + 1);
    QArrayDataPointer<VkSpecParser::TypedName>::~QArrayDataPointer(&(pCVar1->args).d);
    pDVar2 = (pCVar1->cmd).typeSuffix.d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pCVar1->cmd).typeSuffix.d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar2 = (pCVar1->cmd).type.d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pCVar1->cmd).type.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar8 = *(int **)&(pCVar1->cmd).name.d.d;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pCVar1->cmd).name.d.d,2,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<VkSpecParser::Command_*>,_long_long>::
  Destructor::~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}